

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

void sysbvm_tuple_registerPrimitives(void)

{
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_getType,"RawTuple::type");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_setType,"RawTuple::type:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_storedIdentityHash,"RawTuple::storedIdentityHash");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_pointerIdentityHash,"RawTuple::pointerIdentityHash");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_setIdentityHash,"RawTuple::identityHash:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_slotAt,"RawTuple::slotAt:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_slotAtPut,"RawTuple::slotAt:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_uncheckedSlotAt,"RawTuple::uncheckedSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_uncheckedSlotAtPut,"RawTuple::uncheckedSlotAt:put:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteSlotAt,"RawTuple::byteSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_byteSlotAtPut,"RawTuple::byteSlotAt:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_uncheckedByteSlotAt,"RawTuple::uncheckedByteSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_uncheckedByteSlotAtPut,"RawTuple::uncheckedByteSlotAt:put:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_refSlotAt,"RawTuple::refSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_refSlotAtPut,"RawTuple::refSlotAt:put:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_typeSlotAt,"RawTuple::typeSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_typeSlotAtPut,"RawTuple::typeSlotAt:put:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_refTypeSlotAt,"RawTuple::refTypeSlotAt:");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_refTypeSlotAtPut,"RawTuple::refTypeSlotAt:put:");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_new,"RawTuple::new");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteNew,"RawTuple::byteNew");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak
             ,
             "RawTuple::basicAllocateWithType:instanceSize:alignment:slotCount:variableSize:isBytes:isWeak:"
            );
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_isBytes,"RawTuple::isBytes");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_isWeak,"RawTuple::isWeak");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_isDummyValue,"RawTuple::isDummyValue");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_size,"RawTuple::size");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_uncheckedPointersSize,"RawTuple::uncheckedPointersSize");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteSize,"RawTuple::byteSize");
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_shallowCopy,"RawTuple::shallowCopy")
  ;
  sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_markWeak,"RawTuple::markWeak");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_markDummyValue,"RawTuple::markDumyValue");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_firstInstanceWithType,"RawTuple::firstInstanceWithType");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_nextInstanceWithSameType,"RawTuple::nextInstanceWithSameType");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_firstInstance,"RawTuple::firstInstance");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_nextInstance,"RawTuple::nextInstance");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_recordBindingWithOwnerAndName,
             "RawTuple::recordBindingWithOwnerAndName");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_objectModel_isLogical,"ObjectModel::isLogical");
  sysbvm_primitiveTable_registerFunction
            (sysbvm_tuple_primitive_objectModel_isNative,"ObjectModel::isNative");
  return;
}

Assistant:

void sysbvm_tuple_registerPrimitives(void)
{
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_getType, "RawTuple::type");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_setType, "RawTuple::type:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_storedIdentityHash, "RawTuple::storedIdentityHash");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_pointerIdentityHash, "RawTuple::pointerIdentityHash");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_setIdentityHash, "RawTuple::identityHash:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_slotAt, "RawTuple::slotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_slotAtPut, "RawTuple::slotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_uncheckedSlotAt, "RawTuple::uncheckedSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_uncheckedSlotAtPut, "RawTuple::uncheckedSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteSlotAt, "RawTuple::byteSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteSlotAtPut, "RawTuple::byteSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_uncheckedByteSlotAt, "RawTuple::uncheckedByteSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_uncheckedByteSlotAtPut, "RawTuple::uncheckedByteSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_refSlotAt, "RawTuple::refSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_refSlotAtPut, "RawTuple::refSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_typeSlotAt, "RawTuple::typeSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_typeSlotAtPut, "RawTuple::typeSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_refTypeSlotAt, "RawTuple::refTypeSlotAt:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_refTypeSlotAtPut, "RawTuple::refTypeSlotAt:put:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_new, "RawTuple::new");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteNew, "RawTuple::byteNew");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_basicAllocateWithTypeInstanceSizeAlignmentSlotCountIsBytesIsWeak, "RawTuple::basicAllocateWithType:instanceSize:alignment:slotCount:variableSize:isBytes:isWeak:");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_isBytes, "RawTuple::isBytes");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_isWeak, "RawTuple::isWeak");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_isDummyValue, "RawTuple::isDummyValue");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_size, "RawTuple::size");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_uncheckedPointersSize, "RawTuple::uncheckedPointersSize");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_byteSize, "RawTuple::byteSize");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_shallowCopy, "RawTuple::shallowCopy");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_markWeak, "RawTuple::markWeak");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_markDummyValue, "RawTuple::markDumyValue");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_firstInstanceWithType, "RawTuple::firstInstanceWithType");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_nextInstanceWithSameType, "RawTuple::nextInstanceWithSameType");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_firstInstance, "RawTuple::firstInstance");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_nextInstance, "RawTuple::nextInstance");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_recordBindingWithOwnerAndName, "RawTuple::recordBindingWithOwnerAndName");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_objectModel_isLogical, "ObjectModel::isLogical");
    sysbvm_primitiveTable_registerFunction(sysbvm_tuple_primitive_objectModel_isNative, "ObjectModel::isNative");
}